

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

char duckdb::Cast::Operation<unsigned_short,signed_char>(unsigned_short input)

{
  bool bVar1;
  InvalidInputException *this;
  char result;
  unsigned_short in_stack_000001ae;
  string *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  char local_3;
  
  bVar1 = TryCast::Operation<unsigned_short,signed_char>
                    ((uint16_t)((ulong)in_stack_ffffffffffffffc0 >> 0x30),
                     (int8_t *)in_stack_ffffffffffffffb8,false);
  if (!bVar1) {
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    CastExceptionText<unsigned_short,signed_char>(in_stack_000001ae);
    InvalidInputException::InvalidInputException(this,in_stack_ffffffffffffffb8);
    __cxa_throw(this,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException)
    ;
  }
  return local_3;
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}